

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::
HasPendingDisposeHeapBlocks
          (HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *this)

{
  return false;
}

Assistant:

bool
HeapBucketT<TBlockType>::HasPendingDisposeHeapBlocks() const
{
#ifdef RECYCLER_WRITE_BARRIER
    return (IsFinalizableBucket || IsFinalizableWriteBarrierBucket) &&
    ((SmallFinalizableHeapBucketT<typename TBlockType::HeapBlockAttributes> *)this)->pendingDisposeList != nullptr;
#else
    return IsFinalizableBucket && ((SmallFinalizableHeapBucketT<typename TBlockType::HeapBlockAttributes> *)this)->pendingDisposeList != nullptr;
#endif
}